

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_renderer.cpp
# Opt level: O2

void __thiscall dpfb::FontRendererCreator::FontRendererCreator(FontRendererCreator *this,char *name)

{
  char *__s2;
  int iVar1;
  FontRendererCreator *pFVar2;
  FontRendererCreator **ppFVar3;
  
  this->_vptr_FontRendererCreator = (_func_int **)&PTR__FontRendererCreator_00128808;
  this->name = name;
  pFVar2 = findPlugin<dpfb::FontRendererCreator>(name);
  if (pFVar2 != (FontRendererCreator *)0x0) {
    fprintf(_stderr,"FontRendererCreator \"%s\" is already registered\n",this->name);
    exit(1);
  }
  __s2 = this->name;
  ppFVar3 = (FontRendererCreator **)&list;
  while (pFVar2 = *ppFVar3, pFVar2 != (FontRendererCreator *)0x0) {
    iVar1 = strcmp(pFVar2->name,__s2);
    if (-1 < iVar1) break;
    ppFVar3 = &pFVar2->next;
  }
  this->next = pFVar2;
  *ppFVar3 = this;
  return;
}

Assistant:

FontRendererCreator::FontRendererCreator(const char* name)
    : name {name}
{
    LINK_PLUGIN(FontRendererCreator);
}